

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *pvVar4;
  size_t __n;
  uint uVar5;
  Mat *pMVar6;
  long lVar7;
  int id;
  int len;
  uint local_40;
  int local_3c;
  void *local_38;
  
  clear(this);
  local_40 = 0;
  fread(&local_40,4,1,(FILE *)fp);
  if (local_40 != 0xffffff17) {
    do {
      if ((int)local_40 < -0x5b03) {
        uVar5 = -local_40 - 0x5b04;
        local_3c = 0;
        local_40 = uVar5;
        fread(&local_3c,4,1,(FILE *)fp);
        iVar3 = local_3c;
        pMVar6 = &this->params[uVar5].v;
        __n = (size_t)local_3c;
        if ((((this->params[uVar5].v.dims == 1) && (this->params[uVar5].v.w == local_3c)) &&
            (this->params[uVar5].v.elemsize == 4)) &&
           ((this->params[uVar5].v.packing == 1 &&
            (this->params[uVar5].v.allocator == (Allocator *)0x0)))) {
          pvVar4 = pMVar6->data;
        }
        else {
          piVar1 = this->params[uVar5].v.refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = this->params[uVar5].v.allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pMVar6->data != (void *)0x0) {
                  free(pMVar6->data);
                }
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          pMVar6->data = (void *)0x0;
          this->params[uVar5].v.refcount = (int *)0x0;
          this->params[uVar5].v.elemsize = 4;
          this->params[uVar5].v.packing = 1;
          this->params[uVar5].v.allocator = (Allocator *)0x0;
          this->params[uVar5].v.dims = 1;
          this->params[uVar5].v.w = iVar3;
          this->params[uVar5].v.h = 1;
          this->params[uVar5].v.c = 1;
          this->params[uVar5].v.cstep = __n;
          if (iVar3 == 0) {
            __n = 0;
            pvVar4 = (void *)0x0;
          }
          else {
            local_38 = (void *)0x0;
            iVar3 = posix_memalign(&local_38,0x10,__n * 4 + 4);
            pvVar4 = (void *)0x0;
            if (iVar3 == 0) {
              pvVar4 = local_38;
            }
            pMVar6->data = pvVar4;
            this->params[uVar5].v.refcount = (int *)((long)pvVar4 + __n * 4);
            *(undefined4 *)((long)pvVar4 + __n * 4) = 1;
            pvVar4 = local_38;
          }
        }
        fread(pvVar4,4,__n,(FILE *)fp);
        lVar7 = (long)(int)local_40;
      }
      else {
        lVar7 = (long)(int)local_40;
        fread(&this->params[lVar7].field_1,4,1,(FILE *)fp);
      }
      this->params[lVar7].loaded = 1;
      fread(&local_40,4,1,(FILE *)fp);
    } while (local_40 != 0xffffff17);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}